

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

uint nk_check_flags_label(nk_context *ctx,char *label,uint flags,uint value)

{
  long lVar1;
  nk_bool nVar2;
  long lVar3;
  uint uVar4;
  
  lVar3 = 0;
  if ((label != (char *)0x0) && (*label != '\0')) {
    lVar3 = 0;
    do {
      lVar1 = lVar3 + 1;
      lVar3 = lVar3 + 1;
    } while (label[lVar1] != '\0');
  }
  uVar4 = flags;
  if (label != (char *)0x0 && ctx != (nk_context *)0x0) {
    nVar2 = nk_check_text(ctx,label,(int)lVar3,value & flags);
    uVar4 = ~value & flags;
    if (nVar2 != 0) {
      uVar4 = value | flags;
    }
  }
  return uVar4;
}

Assistant:

NK_API unsigned int nk_check_flags_label(struct nk_context *ctx, const char *label,
unsigned int flags, unsigned int value)
{
return nk_check_flags_text(ctx, label, nk_strlen(label), flags, value);
}